

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O2

string * __thiscall
font2svg::glyph::pointlines_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  undefined1 *puVar1;
  string *psVar2;
  ostream *poVar3;
  int j;
  long lVar4;
  ulong uVar5;
  string dash_mod;
  allocator<char> local_61;
  undefined1 *local_60;
  string *local_58;
  string local_50 [32];
  
  local_58 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"",&local_61);
  local_60 = &this->field_0x278;
  std::__cxx11::stringbuf::str((string *)local_60);
  std::__cxx11::string::~string(local_50);
  puVar1 = &this->field_0x270;
  std::operator<<((ostream *)puVar1,"\n\n  <!-- draw straight lines between points -->");
  std::operator<<((ostream *)puVar1,"\n  <path fill=\'none\' stroke=\'green\' d=\'");
  poVar3 = std::operator<<((ostream *)puVar1,"\n   M ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::operator<<(poVar3,"\n");
  std::operator<<((ostream *)puVar1,"\n  \'/>");
  for (uVar5 = 0; psVar2 = local_58, (long)uVar5 < (long)(this->ftoutline).n_points + -1;
      uVar5 = uVar5 + 1) {
    std::__cxx11::string::string<std::allocator<char>>(local_50,"",&local_61);
    for (lVar4 = 0; lVar4 < (this->ftoutline).n_contours; lVar4 = lVar4 + 1) {
      if (uVar5 == (uint)(int)this->contours[lVar4]) {
        std::__cxx11::string::assign((char *)local_50);
      }
    }
    std::operator<<((ostream *)puVar1,"\n  <path fill=\'none\' stroke=\'green\'");
    std::operator<<((ostream *)puVar1,local_50);
    std::operator<<((ostream *)puVar1," d=\'");
    poVar3 = std::operator<<((ostream *)puVar1," M ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3,",");
    std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<((ostream *)puVar1," L ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3,",");
    std::ostream::_M_insert<long>((long)poVar3);
    std::operator<<((ostream *)puVar1,"\n  \'/>");
    std::__cxx11::string::~string(local_50);
  }
  std::__cxx11::stringbuf::str();
  return psVar2;
}

Assistant:

std::string pointlines()  {
		tmp.str("");
		tmp << "\n\n  <!-- draw straight lines between points -->";
		tmp << "\n  <path fill='none' stroke='green' d='";
		tmp << "\n   M " << ftpoints[0].x << "," << ftpoints[0].y << "\n";
		tmp << "\n  '/>";
		for ( int i = 0 ; i < ftoutline.n_points-1 ; i++ ) {
			std::string dash_mod("");
			for (int j = 0 ; j < ftoutline.n_contours; j++ ) {
				if (i==contours[j])
					dash_mod = " stroke-dasharray='3'";
			}
			tmp << "\n  <path fill='none' stroke='green'";
			tmp << dash_mod;
			tmp << " d='";
 			tmp << " M " << ftpoints[i].x << "," << ftpoints[i].y;
 			tmp << " L " << ftpoints[(i+1)%ftoutline.n_points].x << "," << ftpoints[(i+1)%ftoutline.n_points].y;
			tmp << "\n  '/>";
		}
		return tmp.str();
	}